

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::characterReplace_abi_cxx11_
                   (string_view source,char key,string_view repStr)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  char in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  value_type sourceChar;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  string *result;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  size_type in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pbVar3 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
  for (; pvVar1 != pvVar2; pvVar1 = pvVar1 + 1) {
    if (*pvVar1 == in_CL) {
      std::__cxx11::string::operator+=(in_RDI,in_stack_ffffffffffffff88);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(*pvVar1,in_stack_ffffffffffffffa0),(char)((ulong)pbVar3 >> 0x38));
    }
  }
  return (string *)in_RDI;
}

Assistant:

std::string characterReplace(
        std::string_view source,
        char key,
        std::string_view repStr)
    {
        std::string result;
        result.reserve(source.length());
        for (auto sourceChar : source) {
            if (sourceChar == key) {
                result += repStr;
            } else {
                result.push_back(sourceChar);
            }
        }
        return result;
    }